

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextbookBoyerMoore.cpp
# Opt level: O2

void __thiscall
UnifiedRegex::TextbookBoyerMoore<char16_t>::Setup
          (TextbookBoyerMoore<char16_t> *this,ArenaAllocator *allocator,Char *pat,CharCount patLen,
          int skip)

{
  ulong uVar1;
  int32 *ptr;
  ulong uVar2;
  uint uVar3;
  uint uVar4;
  CharCount v;
  bool bVar5;
  
  uVar4 = 0;
  uVar1 = 0;
  if (0 < skip) {
    uVar1 = (ulong)(uint)skip;
  }
  v = 0;
  while( true ) {
    uVar2 = uVar1;
    uVar3 = uVar4;
    if (v == patLen) break;
    while (bVar5 = uVar2 != 0, uVar2 = uVar2 - 1, bVar5) {
      CharMap<char16_t,_int,_(UnifiedRegex::CharMapScheme)1>::Set
                (&this->lastOccurrence,allocator,pat[uVar3],v);
      uVar3 = uVar3 + 1;
    }
    v = v + 1;
    uVar4 = uVar4 + skip;
  }
  ptr = TextbookBoyerMooreSetup<char16_t>::GetGoodSuffix(allocator,pat,patLen,skip);
  Memory::WriteBarrierPtr<int>::WriteBarrierSet(&this->goodSuffix,ptr);
  return;
}

Assistant:

void TextbookBoyerMoore<C>::Setup(ArenaAllocator * allocator, const Char * pat, CharCount patLen, int skip)
    {
        // character c |-> index of last occurrence of c in pat, otherwise -1
        for (CharCount i = 0; i < patLen; i++)
        {
            for (int j = 0; j < skip; j++)
                lastOccurrence.Set(allocator, pat[i * skip + j], i);
        }
        goodSuffix = TextbookBoyerMooreSetup<C>::GetGoodSuffix(allocator, pat, patLen, skip);
    }